

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_gej *in_RSI;
  secp256k1_gej *in_RDI;
  
  secp256k1_gej_verify(in_RSI);
  in_RDI->infinity = in_RSI->infinity;
  memcpy(in_RDI,in_RSI,0x28);
  memcpy(&in_RDI->y,&in_RSI->y,0x28);
  memcpy(&in_RDI->z,&in_RSI->z,0x28);
  secp256k1_fe_impl_normalize_weak(&in_RDI->y);
  secp256k1_fe_impl_negate_unchecked(&in_RDI->y,&in_RDI->y,1);
  secp256k1_gej_verify(in_RDI);
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    secp256k1_gej_verify(a);
    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
    secp256k1_gej_verify(r);
}